

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void rename_bb_insn(gen_ctx_t gen_ctx,bb_insn_t_conflict bb_insn)

{
  MIR_insn_t insn_00;
  MIR_insn_t insn_01;
  MIR_reg_t reg_00;
  int iVar1;
  MIR_reg_t new_reg_00;
  undefined1 local_68 [8];
  insn_var_iterator_t iter;
  ssa_edge_t_conflict ssa_edge;
  MIR_insn_t use_insn;
  MIR_insn_t def_insn;
  MIR_insn_t insn;
  MIR_reg_t new_reg;
  MIR_reg_t reg;
  MIR_reg_t var;
  int op_num;
  bb_insn_t_conflict bb_insn_local;
  gen_ctx_t gen_ctx_local;
  
  insn_00 = bb_insn->insn;
  _var = bb_insn;
  bb_insn_local = (bb_insn_t_conflict)gen_ctx;
  insn_var_iterator_init((insn_var_iterator_t *)local_68,insn_00);
  while (iVar1 = output_insn_var_iterator_next
                           ((gen_ctx_t)bb_insn_local,(insn_var_iterator_t *)local_68,&new_reg,
                            (int *)&reg), iVar1 != 0) {
    if ((0x21 < new_reg) &&
       ((iter.op_part_num = (size_t)insn_00->ops[(int)reg].data,
        (void *)iter.op_part_num == (void *)0x0 || (*(char *)(iter.op_part_num + 0x10) == '\0')))) {
      if ((bb_insn_local->gvn_val != 0) && (1 < *(int *)&(bb_insn_local->bb_insn_link).prev)) {
        fprintf((FILE *)bb_insn_local->gvn_val,"  Start def insn %-5lu",(ulong)_var->index);
        print_bb_insn((gen_ctx_t)bb_insn_local,_var,0);
      }
      reg_00 = new_reg;
      new_reg_00 = get_new_ssa_reg((gen_ctx_t)bb_insn_local,new_reg,0x40,0);
      if (iter.op_part_num == 0) {
        if (new_reg_00 != 0xffffffff) {
          rename_op_reg((gen_ctx_t)bb_insn_local,insn_00->ops + (int)reg,reg_00,new_reg_00,insn_00,1
                       );
        }
      }
      else {
        VARR_ssa_edge_ttrunc
                  ((VARR_ssa_edge_t *)bb_insn_local[3].insn_dead_vars.tail[1].dead_var_link.next,0);
        process_insn_to_rename((gen_ctx_t)bb_insn_local,insn_00,reg);
        if (new_reg_00 != 0xffffffff) {
          while (iVar1 = pop_to_rename((gen_ctx_t)bb_insn_local,
                                       (ssa_edge_t_conflict *)&iter.op_part_num), iVar1 != 0) {
            insn_01 = (MIR_insn_t)**(undefined8 **)iter.op_part_num;
            rename_op_reg((gen_ctx_t)bb_insn_local,
                          ((MIR_insn_t)**(undefined8 **)(iter.op_part_num + 8))->ops +
                          *(ushort *)(iter.op_part_num + 0x12),reg_00,new_reg_00,
                          (MIR_insn_t)**(undefined8 **)(iter.op_part_num + 8),1);
            rename_op_reg((gen_ctx_t)bb_insn_local,insn_01->ops + *(uint *)(iter.op_part_num + 0x14)
                          ,reg_00,new_reg_00,insn_01,1);
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void rename_bb_insn (gen_ctx_t gen_ctx, bb_insn_t bb_insn) {
  int op_num;
  MIR_reg_t var, reg, new_reg;
  MIR_insn_t insn, def_insn, use_insn;
  ssa_edge_t ssa_edge;
  insn_var_iterator_t iter;

  insn = bb_insn->insn;
  FOREACH_OUT_INSN_VAR (gen_ctx, iter, insn, var, op_num) {
    if (var <= MAX_HARD_REG) continue;
    ssa_edge = insn->ops[op_num].data;
    if (ssa_edge != NULL && ssa_edge->flag) continue; /* already processed */
    DEBUG (2, {
      fprintf (debug_file, "  Start def insn %-5lu", (long unsigned) bb_insn->index);
      print_bb_insn (gen_ctx, bb_insn, FALSE);
    });
    reg = var;
    new_reg = get_new_ssa_reg (gen_ctx, reg, '@', FALSE);
    if (ssa_edge == NULL) { /* special case: unused output */
      if (new_reg != MIR_NON_VAR)
        rename_op_reg (gen_ctx, &insn->ops[op_num], reg, new_reg, insn, TRUE);
      continue;
    }
    VARR_TRUNC (ssa_edge_t, ssa_edges_to_process, 0);
    process_insn_to_rename (gen_ctx, insn, op_num);
    if (new_reg != MIR_NON_VAR) {
      while (pop_to_rename (gen_ctx, &ssa_edge)) {
        def_insn = ssa_edge->def->insn;
        use_insn = ssa_edge->use->insn;
        rename_op_reg (gen_ctx, &def_insn->ops[ssa_edge->def_op_num], reg, new_reg, def_insn, TRUE);
        rename_op_reg (gen_ctx, &use_insn->ops[ssa_edge->use_op_num], reg, new_reg, use_insn, TRUE);
      }
    }
  }
}